

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O3

void test_skip(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *__buf;
  char *__n;
  void *pvVar8;
  void *__s2;
  char *pcVar9;
  char *pcVar10;
  char *extraout_RAX;
  dirent *pdVar11;
  size_t sVar12;
  size_t sVar13;
  DIR *__dirp;
  FILE *__stream;
  long lVar14;
  char *pcVar15;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  char *pcVar16;
  ulong uVar17;
  DIR *__s;
  DIR *__name;
  char *pcVar18;
  DIR *paths;
  DIR *__filename;
  undefined8 uVar19;
  char *pcVar20;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auStack_6d88 [8];
  undefined1 auStack_6d80 [504];
  ulong uStack_6b88;
  DIR *pDStack_6b80;
  dirent *pdStack_6b78;
  DIR *pDStack_6b70;
  DIR *pDStack_6b68;
  stat sStack_6b60;
  char acStack_6ad0 [512];
  size_t sStack_68d0;
  dirent *pdStack_68c8;
  DIR *pDStack_68c0;
  char *pcStack_68b8;
  code *pcStack_68b0;
  char *pcStack_68a8;
  ulong uStack_68a0;
  char *pcStack_6898;
  DIR *pDStack_6890;
  code *pcStack_6888;
  undefined8 uStack_6850;
  undefined1 *puStack_6848;
  undefined1 *puStack_6840;
  undefined1 auStack_6830 [8];
  char *pcStack_6828;
  char *pcStack_6818;
  char *pcStack_6810;
  undefined8 uStack_6808;
  undefined8 uStack_67f0;
  DIR aDStack_6780 [25944];
  char *pcStack_228;
  char *pcStack_220;
  char *pcStack_218;
  char *pcStack_210;
  code *apcStack_208 [2];
  undefined1 auStack_1f8 [116];
  uint uStack_184;
  char acStack_180 [256];
  undefined8 uStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *pcStack_58;
  char *pcStack_50;
  undefined8 uStack_48;
  code *apcStack_40 [2];
  
  apcStack_40[0] = (code *)0x13da1a;
  pcStack_68 = (char *)bson_bcon_magic();
  uStack_48 = 0;
  pcStack_50 = "}";
  pcStack_58 = (char *)0xa;
  pcStack_60 = (char *)0xf;
  pcStack_70 = (char *)0x13da6d;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  apcStack_40[0] = (code *)0x13da79;
  pcVar7 = (char *)bson_bcone_magic();
  pcVar20 = "}";
  uStack_48 = 0;
  pcStack_50 = "}";
  pcStack_58 = (char *)0x10;
  pcStack_60 = (char *)0x1c;
  pcStack_70 = "bar";
  pcStack_78 = "{";
  uStack_80 = 0x13dab5;
  pcStack_68 = pcVar7;
  cVar1 = bcon_extract(uVar6,"hello",pcVar7,0x1c,2);
  if (cVar1 == '\0') {
    apcStack_40[0] = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_48 = 0;
    pcStack_50 = "}";
    pcStack_58 = (char *)0x12;
    pcStack_60 = (char *)0x1c;
    pcStack_70 = "bar";
    pcStack_78 = "{";
    uStack_80 = 0x13daf4;
    pcStack_68 = pcVar7;
    cVar1 = bcon_extract(uVar6,"hello",pcVar7,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  apcStack_40[0] = test_iter;
  test_skip_cold_2();
  apcStack_40[0] = (code *)0x14e902;
  pcStack_50 = "bar";
  pcStack_58 = "}";
  pcStack_68 = "{";
  apcStack_208[0] = (code *)0x13db39;
  pcStack_60 = pcVar7;
  uStack_48 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_208[0] = (code *)0x13db60;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_208[0] = (code *)0x13db68;
  uVar6 = bson_bcone_magic();
  pcVar9 = acStack_180;
  pcVar16 = "foo";
  pcVar15 = (char *)0x1d;
  uVar19 = 0;
  apcStack_208[0] = (code *)0x13db88;
  pcVar18 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  if (cVar1 == '\0') {
    apcStack_208[0] = (code *)0x13dd34;
    uVar6 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_208[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar18 = acStack_180;
    apcStack_208[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar18 = acStack_180;
    apcStack_208[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar19 = 0;
      apcStack_208[0] = (code *)0x13dbdf;
      __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_180);
      apcStack_208[0] = (code *)0x13dbea;
      pcVar7 = (char *)bson_get_data(__n_00);
      apcStack_208[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n);
      if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
        apcStack_208[0] = (code *)0x13dc09;
        pvVar8 = (void *)bson_get_data(__n);
        apcStack_208[0] = (code *)0x13dc14;
        __s2 = (void *)bson_get_data(__n_00);
        apcStack_208[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar8,__s2,(ulong)*(uint *)(__n + 4));
        if (iVar2 == 0) {
          apcStack_208[0] = (code *)0x13dc2e;
          bson_destroy(__n);
          apcStack_208[0] = (code *)0x13dc36;
          bson_destroy(__n_00);
          return;
        }
      }
      apcStack_208[0] = (code *)0x13dc4f;
      pcVar20 = (char *)bson_as_canonical_extended_json(__n_00);
      apcStack_208[0] = (code *)0x13dc5c;
      pcVar9 = (char *)bson_as_canonical_extended_json(__n);
      uVar3 = *(uint *)(__n_00 + 4);
      uVar4 = *(uint *)(__n + 4);
      uVar6 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar17 = 0;
        do {
          if (uVar4 == (uint)uVar17) break;
          if (pcVar7[uVar17] != __buf[uVar17]) goto LAB_0013dd28;
          uVar17 = uVar17 + 1;
        } while (uVar3 != (uint)uVar17);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar17 = (ulong)(uVar3 - 1);
      pcVar15 = pcVar20;
      while( true ) {
        apcStack_208[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17);
        apcStack_208[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar20 = (char *)(ulong)uVar3;
        pcVar18 = "failure.expected.bson";
        pcVar16 = (char *)0x42;
        apcStack_208[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_184 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar20 = (char *)(ulong)uVar4;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        pcVar18 = (char *)(ulong)uVar3;
        apcStack_208[0] = (code *)0x13dd01;
        pcVar16 = pcVar7;
        pcVar10 = (char *)write(uVar3,pcVar7,(size_t)__n_00);
        if (pcVar10 != __n_00) goto LAB_0013dd48;
        __n = (char *)(ulong)*(uint *)(__n + 4);
        apcStack_208[0] = (code *)0x13dd17;
        pcVar16 = __buf;
        pcVar18 = pcVar20;
        pcVar10 = (char *)write(uVar4,__buf,(size_t)__n);
        if (pcVar10 != __n) goto LAB_0013dd4d;
        uVar17 = (ulong)uVar4;
        apcStack_208[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar9 = extraout_RAX;
LAB_0013dd28:
        uVar17 = uVar17 & 0xffffffff;
        pcVar15 = pcVar20;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_208[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_208[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_208[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_208[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_208[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6840 = auStack_6830;
  if (extraout_AL != '\0') {
    uStack_67f0 = uVar6;
  }
  pcStack_6888 = (code *)0x13ddd5;
  pcStack_6828 = pcVar16;
  pcStack_6818 = pcVar15;
  pcStack_6810 = pcVar9;
  uStack_6808 = uVar19;
  pcStack_228 = __n;
  pcStack_220 = pcVar7;
  pcStack_218 = __buf;
  pcStack_210 = __n_00;
  apcStack_208[0] = (code *)apcStack_40;
  bcon_extract_ctx_init(aDStack_6780);
  puStack_6848 = auStack_1f8;
  uStack_6850 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_6828) {
    uVar3 = (uint)pcStack_6828;
    do {
      pcStack_6888 = (code *)0x13de41;
      __s = aDStack_6780;
      pcVar7 = pcVar18;
      cVar1 = bcon_extract_ctx_va(pcVar18,aDStack_6780,&uStack_6850);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        pcStack_6888 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_68b0 = (code *)0x13de73;
        __name = __s;
        pcStack_68a8 = pcVar18;
        uStack_68a0 = (ulong)uVar3;
        pcStack_6898 = pcVar20;
        pDStack_6890 = aDStack_6780;
        pcStack_6888 = (code *)&uStack_6850;
        pdVar11 = (dirent *)strlen(pcVar7);
        pcStack_68b0 = (code *)0x13de7e;
        paths = __s;
        sVar12 = strlen((char *)__s);
        if ((int)sVar12 + (int)pdVar11 < 499) {
          pcStack_68b0 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_68b0 = (code *)0x13dea8;
          strncat(__dest,pcVar7,(long)(int)pdVar11);
          pcStack_68b0 = (code *)0x13deb0;
          sVar13 = strlen(__dest);
          (__dest + sVar13)[0] = '/';
          (__dest + sVar13)[1] = '\0';
          pcStack_68b0 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar12);
          pcVar7 = __dest;
          do {
            if (*pcVar7 == '\\') {
              *pcVar7 = '/';
            }
            else if (*pcVar7 == '\0') {
              return;
            }
            pcVar7 = pcVar7 + 1;
          } while( true );
        }
        pcStack_68b0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar17 = (ulong)extraout_EDX;
        pDStack_6b68 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_68d0 = sVar12;
        pdStack_68c8 = pdVar11;
        pDStack_68c0 = __s;
        pcStack_68b8 = pcVar7;
        pcStack_68b0 = (code *)apcStack_208;
        __dirp = opendir((char *)__name);
        pDStack_6b70 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_6b68 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar11 = readdir(__dirp);
        do {
          if (pdVar11 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_6b68 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar17;
          if (iVar2 <= paths_index) {
            pDStack_6b68 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_6b70 = __dirp;
LAB_0013e018:
            pDStack_6b68 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_6b88 = uVar17;
            pDStack_6b80 = paths;
            pdStack_6b78 = pdVar11;
            pDStack_6b68 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar12 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar12) {
                pvVar8 = (void *)bson_malloc0(sVar12);
                sVar13 = fread(pvVar8,1,sVar12,__stream);
                if (sVar13 != sVar12) {
                  abort();
                }
                fclose(__stream);
                if (pvVar8 != (void *)0x0) {
                  lVar14 = bson_new_from_json(pvVar8,sVar12,auStack_6d88);
                  if (lVar14 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_6d80);
                    abort();
                  }
                  bson_free(pvVar8);
                }
              }
            }
            return;
          }
          while ((pdVar11->d_name[0] == '.' &&
                 (((pdVar11->d_name[1] == '.' && (pdVar11->d_name[2] == '\0')) ||
                  (pdVar11->d_name[1] == '\0'))))) {
            pDStack_6b68 = (DIR *)0x13df58;
            pdVar11 = readdir(__dirp);
            if (pdVar11 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar7 = pdVar11->d_name;
          pDStack_6b68 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar7,acStack_6ad0);
          pDStack_6b68 = (DIR *)0x13df87;
          iVar5 = stat(pcVar7,&sStack_6b60);
          if ((iVar5 == 0) && ((sStack_6b60.st_mode & 0xf000) == 0x4000)) {
            pDStack_6b68 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_6ad0,paths_index,iVar2);
            uVar17 = (ulong)uVar3;
          }
          else {
            pDStack_6b68 = (DIR *)0x13dfc4;
            pcVar20 = strstr(pcVar7,".json");
            if (pcVar20 != (char *)0x0) {
              uVar17 = (ulong)(paths_index + 1);
              pDStack_6b68 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar7,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_6b68 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar11 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_skip (void)
{
   bson_t *bcon =
      BCON_NEW ("hello", "world", "foo", "{", "bar", BCON_INT32 (10), "}");

   BSON_ASSERT (BCON_EXTRACT (bcon,
                         "hello",
                         BCONE_SKIP (BSON_TYPE_UTF8),
                         "foo",
                         "{",
                         "bar",
                         BCONE_SKIP (BSON_TYPE_INT32),
                         "}"));

   BSON_ASSERT (!BCON_EXTRACT (bcon,
                          "hello",
                          BCONE_SKIP (BSON_TYPE_UTF8),
                          "foo",
                          "{",
                          "bar",
                          BCONE_SKIP (BSON_TYPE_INT64),
                          "}"));

   bson_destroy (bcon);
}